

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

void nlohmann::adl_serializer<Eigen::Matrix<double,1,3,1,1,3>,void>::
     from_json<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *json,Vector<3> *point)

{
  value_t vVar1;
  ulong uVar2;
  const_reference j;
  int i;
  size_type idx;
  
  vVar1 = json->m_type;
  uVar2 = (ulong)vVar1;
  if (vVar1 != null) {
    if (vVar1 == object) {
      uVar2 = (((json->m_value).object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (vVar1 == array) {
      uVar2 = (long)((((json->m_value).object)->m_keys)._M_h._M_bucket_count -
                    (long)(((json->m_value).object)->m_keys)._M_h._M_buckets) >> 4;
    }
    else {
      uVar2 = 1;
    }
  }
  if (uVar2 == 3) {
    idx = 0;
    do {
      j = basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::at(json,idx);
      detail::
      get_arithmetic_value<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                (j,(double *)point);
      idx = idx + 1;
      point = (Vector<3> *)((long)point + 8);
    } while (idx != 3);
    return;
  }
  __assert_fail("json.size() == point.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/Json.h"
                ,0x4c,
                "static void nlohmann::adl_serializer<Eigen::Matrix<double, 1, 3>>::from_json(const TJson &, anurbs::linear_algebra::Vector<3> &) [TJson = nlohmann::basic_json<anurbs::FiFoMap>]"
               );
}

Assistant:

static void from_json(const TJson& json, anurbs::linear_algebra::Vector<3>& point)
        {
            assert(json.size() == point.size());

            for (int i = 0; i < point.size(); i++) {
                json.at(i).get_to(point[i]);
            }
        }